

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void Fossilize::Hashing::hash_pnext_struct
               (StateRecorder *param_1,Hasher *h,VkSampleLocationsInfoEXT *info)

{
  uint local_24;
  uint32_t i;
  VkSampleLocationsInfoEXT *info_local;
  Hasher *h_local;
  StateRecorder *param_0_local;
  
  Hasher::u32(h,info->sampleLocationsCount);
  Hasher::u32(h,(info->sampleLocationGridSize).width);
  Hasher::u32(h,(info->sampleLocationGridSize).height);
  Hasher::u32(h,info->sampleLocationsPerPixel);
  for (local_24 = 0; local_24 < info->sampleLocationsCount; local_24 = local_24 + 1) {
    Hasher::f32(h,info->pSampleLocations[local_24].x);
    Hasher::f32(h,info->pSampleLocations[local_24].y);
  }
  return;
}

Assistant:

static void hash_pnext_struct(const StateRecorder *, Hasher &h,
                              const VkSampleLocationsInfoEXT &info)
{
	h.u32(info.sampleLocationsCount);
	h.u32(info.sampleLocationGridSize.width);
	h.u32(info.sampleLocationGridSize.height);
	h.u32(info.sampleLocationsPerPixel);
	for (uint32_t i = 0; i < info.sampleLocationsCount; i++)
	{
		h.f32(info.pSampleLocations[i].x);
		h.f32(info.pSampleLocations[i].y);
	}
}